

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O1

int VP8ApplyNearLossless(WebPPicture *picture,int quality,uint32_t *argb_dst)

{
  uint ysize;
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t *copy_buffer;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = picture->width;
  lVar6 = (long)iVar3;
  ysize = picture->height;
  iVar4 = picture->argb_stride;
  copy_buffer = (uint32_t *)WebPSafeMalloc(lVar6 * 3,4);
  if (copy_buffer == (uint32_t *)0x0) {
    iVar3 = 0;
  }
  else {
    if ((int)ysize < 3 || (int)ysize < 0x40 && iVar3 < 0x40) {
      if (0 < (int)ysize) {
        uVar5 = 0;
        do {
          memcpy(argb_dst,picture->argb + (long)picture->argb_stride * uVar5,lVar6 * 4);
          uVar5 = uVar5 + 1;
          argb_dst = argb_dst + lVar6;
        } while (ysize != uVar5);
      }
    }
    else {
      iVar2 = (int)((ulong)((long)quality * -0x66666667) >> 0x20);
      iVar1 = iVar2 >> 3;
      iVar2 = iVar2 >> 0x1f;
      NearLossless(iVar3,ysize,picture->argb,iVar4,(iVar1 - iVar2) + 5,copy_buffer,argb_dst);
      for (iVar4 = (iVar1 - iVar2) + 4; iVar4 != 0; iVar4 = iVar4 + -1) {
        NearLossless(iVar3,ysize,argb_dst,iVar3,iVar4,copy_buffer,argb_dst);
      }
    }
    WebPSafeFree(copy_buffer);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int VP8ApplyNearLossless(const WebPPicture* const picture, int quality,
                         uint32_t* const argb_dst) {
  int i;
  const int xsize = picture->width;
  const int ysize = picture->height;
  const int stride = picture->argb_stride;
  uint32_t* const copy_buffer =
      (uint32_t*)WebPSafeMalloc(xsize * 3, sizeof(*copy_buffer));
  const int limit_bits = VP8LNearLosslessBits(quality);
  assert(argb_dst != NULL);
  assert(limit_bits > 0);
  assert(limit_bits <= MAX_LIMIT_BITS);
  if (copy_buffer == NULL) {
    return 0;
  }
  // For small icon images, don't attempt to apply near-lossless compression.
  if ((xsize < MIN_DIM_FOR_NEAR_LOSSLESS &&
       ysize < MIN_DIM_FOR_NEAR_LOSSLESS) ||
      ysize < 3) {
    for (i = 0; i < ysize; ++i) {
      memcpy(argb_dst + i * xsize, picture->argb + i * picture->argb_stride,
             xsize * sizeof(*argb_dst));
    }
    WebPSafeFree(copy_buffer);
    return 1;
  }

  NearLossless(xsize, ysize, picture->argb, stride, limit_bits, copy_buffer,
               argb_dst);
  for (i = limit_bits - 1; i != 0; --i) {
    NearLossless(xsize, ysize, argb_dst, xsize, i, copy_buffer, argb_dst);
  }
  WebPSafeFree(copy_buffer);
  return 1;
}